

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

OpenMPClause *
OpenMPLastprivateClause::addLastprivateClause
          (OpenMPDirective *directive,OpenMPLastprivateClauseModifier modifier)

{
  bool bVar1;
  OpenMPLastprivateClauseModifier OVar2;
  size_type sVar3;
  OpenMPLastprivateClause *pOVar4;
  OpenMPClause *pOVar5;
  mapped_type *ppvVar6;
  reference ppOVar7;
  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
  local_58;
  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
  local_50;
  iterator it;
  OpenMPLastprivateClause *local_38;
  OpenMPClause *new_clause;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *current_clauses;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *all_clauses;
  OpenMPDirective *pOStack_18;
  OpenMPLastprivateClauseModifier modifier_local;
  OpenMPDirective *directive_local;
  
  all_clauses._4_4_ = modifier;
  pOStack_18 = directive;
  current_clauses =
       (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)
       OpenMPDirective::getAllClauses(directive);
  new_clause = (OpenMPClause *)OpenMPDirective::getClauses(pOStack_18,OMPC_lastprivate);
  local_38 = (OpenMPLastprivateClause *)0x0;
  sVar3 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
  if (sVar3 == 0) {
    pOVar4 = (OpenMPLastprivateClause *)operator_new(0x70);
    OpenMPLastprivateClause(pOVar4,all_clauses._4_4_);
    local_38 = pOVar4;
    pOVar5 = (OpenMPClause *)operator_new(0x18);
    memset(pOVar5,0,0x18);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar5);
    new_clause = pOVar5;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar5,
               (value_type *)&local_38);
    pOVar5 = new_clause;
    it._M_current._0_4_ = 0xd;
    ppvVar6 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[]((map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                            *)current_clauses,(key_type *)&it);
    *ppvVar6 = (mapped_type)pOVar5;
  }
  else {
    local_50._M_current =
         (OpenMPClause **)
         std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::begin
                   ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
    while( true ) {
      local_58._M_current =
           (OpenMPClause **)
           std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::end
                     ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      ppOVar7 = __gnu_cxx::
                __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                ::operator*(&local_50);
      OVar2 = getModifier((OpenMPLastprivateClause *)*ppOVar7);
      if (OVar2 == all_clauses._4_4_) {
        ppOVar7 = __gnu_cxx::
                  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                  ::operator*(&local_50);
        return *ppOVar7;
      }
      __gnu_cxx::
      __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
      ::operator++(&local_50);
    }
    pOVar4 = (OpenMPLastprivateClause *)operator_new(0x70);
    OpenMPLastprivateClause(pOVar4,all_clauses._4_4_);
    local_38 = pOVar4;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause,
               (value_type *)&local_38);
  }
  return &local_38->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPLastprivateClause::addLastprivateClause(OpenMPDirective *directive, OpenMPLastprivateClauseModifier modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_lastprivate);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPLastprivateClause(modifier);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_lastprivate] = current_clauses;
        } else {
            for(std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {

                if (((OpenMPLastprivateClause*)(*it))->getModifier() == modifier) {
                    new_clause = (*it);
                    return new_clause;
                };
            };
            new_clause = new OpenMPLastprivateClause(modifier);
            current_clauses->push_back(new_clause);
        }
    return new_clause;
}